

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btSingleSweepCallback::btSingleSweepCallback
          (btSingleSweepCallback *this,btConvexShape *castShape,btTransform *convexFromTrans,
          btTransform *convexToTrans,btCollisionWorld *world,ConvexResultCallback *resultCallback,
          btScalar allowedPenetration)

{
  btScalar *pbVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 rayDir;
  btVector3 unnormalizedRayDir;
  btTransform *in_stack_fffffffffffffea8;
  btTransform *in_stack_fffffffffffffeb0;
  btVector3 *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  btScalar local_124;
  btScalar local_fc;
  btScalar local_d4;
  btScalar local_88;
  btScalar bStack_84;
  btVector3 local_64;
  btVector3 local_54 [2];
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  local_34 = in_XMM0_Da;
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  btBroadphaseRayCallback::btBroadphaseRayCallback
            ((btBroadphaseRayCallback *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  *in_RDI = &PTR__btSingleSweepCallback_002e2c08;
  btTransform::btTransform(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  btTransform::btTransform(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x15));
  in_RDI[0x17] = local_28;
  in_RDI[0x18] = local_30;
  *(undefined4 *)(in_RDI + 0x19) = local_34;
  in_RDI[0x1a] = local_10;
  btTransform::getOrigin((btTransform *)(in_RDI + 0xd));
  btTransform::getOrigin((btTransform *)(in_RDI + 5));
  bVar3 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8);
  local_54[0].m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_88 = bVar3.m_floats[0];
  bStack_84 = bVar3.m_floats[1];
  local_54[0].m_floats[0] = local_88;
  local_54[0].m_floats[1] = bStack_84;
  bVar3 = btVector3::normalized(in_stack_fffffffffffffeb8);
  local_64.m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_64.m_floats._0_8_ = bVar3.m_floats._0_8_;
  pbVar1 = btVector3::operator_cast_to_float_(&local_64);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_64);
    local_d4 = 1.0 / *pbVar1;
  }
  else {
    local_d4 = 1e+18;
  }
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *pbVar1 = local_d4;
  pbVar1 = btVector3::operator_cast_to_float_(&local_64);
  if ((pbVar1[1] != 0.0) || (NAN(pbVar1[1]))) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_64);
    local_fc = 1.0 / pbVar1[1];
  }
  else {
    local_fc = 1e+18;
  }
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  pbVar1[1] = local_fc;
  pbVar1 = btVector3::operator_cast_to_float_(&local_64);
  if ((pbVar1[2] != 0.0) || (NAN(pbVar1[2]))) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_64);
    local_124 = 1.0 / pbVar1[2];
  }
  else {
    local_124 = 1e+18;
  }
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  pbVar1[2] = local_124;
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)(in_RDI + 3) = (uint)(*pbVar1 < 0.0);
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)((long)in_RDI + 0x1c) = (uint)(pbVar1[1] < 0.0);
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)(in_RDI + 4) = (uint)(pbVar1[2] < 0.0);
  bVar2 = btVector3::dot(&local_64,local_54);
  *(btScalar *)((long)in_RDI + 0x24) = bVar2;
  return;
}

Assistant:

btSingleSweepCallback(const btConvexShape* castShape, const btTransform& convexFromTrans,const btTransform& convexToTrans,const btCollisionWorld* world,btCollisionWorld::ConvexResultCallback& resultCallback,btScalar allowedPenetration)
		:m_convexFromTrans(convexFromTrans),
		m_convexToTrans(convexToTrans),
		m_world(world),
		m_resultCallback(resultCallback),
		m_allowedCcdPenetration(allowedPenetration),
		m_castShape(castShape)
	{
		btVector3 unnormalizedRayDir = (m_convexToTrans.getOrigin()-m_convexFromTrans.getOrigin());
		btVector3 rayDir = unnormalizedRayDir.normalized();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(unnormalizedRayDir);

	}